

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# landb.cpp
# Opt level: O0

db_bit * __thiscall lan::db::find_any(db *this,string *name,db_bit_type type,db_bit *ref)

{
  bool bVar1;
  out_of_range *this_00;
  db_bit *pdVar2;
  string local_b0;
  undefined1 local_8d;
  allocator<char> local_79;
  string local_78;
  string local_58;
  db_bit *local_38;
  db_bit *buf;
  db_bit *ref_local;
  string *psStack_20;
  db_bit_type type_local;
  string *name_local;
  db *this_local;
  
  local_38 = (db_bit *)0x0;
  buf = ref;
  ref_local._4_4_ = type;
  psStack_20 = name;
  name_local = (string *)this;
  bVar1 = std::operator==(name,"@");
  if ((bVar1) && (this->anchor != (anchor_t *)0x0)) {
    this_local = (db *)this->anchor;
  }
  else {
    bVar1 = std::operator==(name,"@");
    if (bVar1) {
      local_8d = 1;
      this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"",&local_79);
      error_string(&local_58,this,_empty_anchor_error,&local_78);
      std::out_of_range::out_of_range(this_00,(string *)&local_58);
      local_8d = 0;
      __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
    }
    while( true ) {
      std::__cxx11::string::string((string *)&local_b0,(string *)name);
      pdVar2 = find(this,&local_b0,buf);
      local_38 = pdVar2;
      std::__cxx11::string::~string((string *)&local_b0);
      if (pdVar2 == (db_bit *)0x0) break;
      if (local_38->type == ref_local._4_4_) {
        return local_38;
      }
      buf = local_38->nex;
    }
    this_local = (db *)0x0;
  }
  return (db_bit *)this_local;
}

Assistant:

lan::db_bit * db::find_any(const std::string name, const lan::db_bit_type type, lan::db_bit * ref){
            lan::db_bit * buf = nullptr;
            if(name == "@" && anchor) return anchor;
            else if(name == "@") throw lan::errors::anchor_name_error(error_string(errors::_private::_empty_anchor_error, ""));
            while ((buf = find(name, ref))) {
                if(buf->type == type) return buf;
                ref = buf->nex;
            } return nullptr;
        }